

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O0

void __thiscall
assembler::VirtualChannel::finish
          (VirtualChannel *this,
          unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  ulong uVar1;
  uint64_t uVar2;
  bool bVar3;
  PrimaryHeader *pPVar4;
  ostream *poVar5;
  pointer pSVar6;
  size_t sVar7;
  uint64_t size;
  PrimaryHeader ph;
  value_type *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_stack_ffffffffffffffa0;
  
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x2dafda);
  bVar3 = SessionPDU::hasCompleteHeader((SessionPDU *)0x2dafe2);
  if (bVar3) {
    pSVar6 = std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
             operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                         *)0x2daff5);
    pPVar4 = SessionPDU::getPrimaryHeader(pSVar6);
    uVar1 = *(ulong *)&pPVar4->totalHeaderLength;
    uVar2 = pPVar4->dataLength;
    std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
              ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
               0x2db044);
    sVar7 = SessionPDU::size((SessionPDU *)0x2db04c);
    if ((uVar1 & 0xffffffff) + (uVar2 + 7 >> 3) == sVar7) {
      std::
      vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
      ::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      return;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"VC ");
  pSVar6 = std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
           operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                       *)0x2db090);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pSVar6->vcid);
  poVar5 = std::operator<<(poVar5,": Dropping malformed S_PDU for APID ");
  pSVar6 = std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
           operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                       *)0x2db0b9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pSVar6->apid);
  poVar5 = std::operator<<(poVar5," (");
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x2db0e4);
  sVar7 = SessionPDU::size((SessionPDU *)0x2db0ec);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
  poVar5 = std::operator<<(poVar5," bytes)");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void VirtualChannel::finish(
    std::unique_ptr<SessionPDU> spdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  // Must have complete header
  if (spdu->hasCompleteHeader()) {
    // Ensure that the reported size is equal to the actual size
    auto ph = spdu->getPrimaryHeader();
    auto size = ph.totalHeaderLength + ((ph.dataLength + 7) / 8);
    if (size == spdu->size()) {
      out.push_back(std::move(spdu));
      return;
    }
  }

  std::cerr
    << "VC "
    << spdu->vcid
    << ": Dropping malformed S_PDU for APID "
    << spdu->apid
    << " (" << spdu->size() << " bytes)"
    << std::endl;
}